

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

void __thiscall
gl4cts::GLSL420Pack::Utils::program::uniform
          (program *this,GLchar *uniform_name,TYPES type,GLuint n_columns,GLuint n_rows,void *data)

{
  int iVar1;
  GLint GVar2;
  GLenum err;
  undefined4 extraout_var;
  uniformNfv p_Var3;
  uniformNiv p_Var4;
  uniformNuiv p_Var5;
  uniformNdv p_Var6;
  uniformMatrixNfv p_Var7;
  uniformMatrixNdv p_Var8;
  TestError *this_00;
  char *msg;
  Functions *gl;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar1);
  GVar2 = getUniformLocation(this,uniform_name);
  switch(type) {
  case FLOAT:
    if (n_columns == 1) {
      p_Var3 = getUniformNfv(gl,n_rows);
      (*p_Var3)(GVar2,1,(GLfloat *)data);
      err = (*gl->getError)();
      msg = "UniformNfv";
      iVar1 = 0x47ac;
    }
    else {
      p_Var7 = getUniformMatrixNfv(gl,n_columns,n_rows);
      (*p_Var7)(GVar2,1,'\0',(GLfloat *)data);
      err = (*gl->getError)();
      msg = "UniformMatrixNfv";
      iVar1 = 0x47b1;
    }
    break;
  case DOUBLE:
    if (n_columns == 1) {
      p_Var6 = getUniformNdv(gl,n_rows);
      (*p_Var6)(GVar2,1,(GLdouble *)data);
      err = (*gl->getError)();
      msg = "UniformNdv";
      iVar1 = 0x47a0;
    }
    else {
      p_Var8 = getUniformMatrixNdv(gl,n_columns,n_rows);
      (*p_Var8)(GVar2,1,'\0',(GLdouble *)data);
      err = (*gl->getError)();
      msg = "UniformMatrixNdv";
      iVar1 = 0x47a5;
    }
    break;
  case INT:
    p_Var4 = getUniformNiv(gl,n_rows);
    (*p_Var4)(GVar2,1,(GLint *)data);
    err = (*gl->getError)();
    msg = "UniformNiv";
    iVar1 = 0x47b6;
    break;
  case UINT:
    p_Var5 = getUniformNuiv(gl,n_rows);
    (*p_Var5)(GVar2,1,(GLuint *)data);
    err = (*gl->getError)();
    msg = "UniformNuiv";
    iVar1 = 0x47ba;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x47bd);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  glu::checkError(err,msg,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,iVar1);
  return;
}

Assistant:

void Utils::program::uniform(const glw::GLchar* uniform_name, TYPES type, glw::GLuint n_columns, glw::GLuint n_rows,
							 const void* data) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	GLuint location = getUniformLocation(uniform_name);

	if ((glw::GLuint)-1 == location)
	{
		TCU_FAIL("Uniform is inactive");
	}

	switch (type)
	{
	case DOUBLE:
		if (1 == n_columns)
		{
			getUniformNdv(gl, n_rows)(location, 1 /* count */, (const GLdouble*)data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "UniformNdv");
		}
		else
		{
			getUniformMatrixNdv(gl, n_columns, n_rows)(location, 1 /* count */, false, (const GLdouble*)data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "UniformMatrixNdv");
		}
		break;
	case FLOAT:
		if (1 == n_columns)
		{
			getUniformNfv(gl, n_rows)(location, 1 /* count */, (const GLfloat*)data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "UniformNfv");
		}
		else
		{
			getUniformMatrixNfv(gl, n_columns, n_rows)(location, 1 /* count */, false, (const GLfloat*)data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "UniformMatrixNfv");
		}
		break;
	case INT:
		getUniformNiv(gl, n_rows)(location, 1 /* count */, (const GLint*)data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UniformNiv");
		break;
	case UINT:
		getUniformNuiv(gl, n_rows)(location, 1 /* count */, (const GLuint*)data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UniformNuiv");
		break;
	default:
		TCU_FAIL("Invalid enum");
	}
}